

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall
MemoryAccountant::createCacheSizeNodes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  size_t i;
  size_t sVar3;
  MemoryAccountant *pMVar4;
  
  for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
    findOrCreateNodeOfSize(this,sizes[sVar3]);
  }
  pMVar2 = this->head_;
  pMVar4 = this;
  if (this->head_ != (MemoryAccountantAllocationNode *)0x0) {
    do {
      pMVar1 = pMVar2;
      pMVar2 = pMVar1->next_;
    } while (pMVar2 != (MemoryAccountantAllocationNode *)0x0);
    pMVar4 = (MemoryAccountant *)&pMVar1->next_;
  }
  pMVar2 = createNewAccountantAllocationNode(this,0,(MemoryAccountantAllocationNode *)0x0);
  pMVar4->head_ = pMVar2;
  return;
}

Assistant:

void MemoryAccountant::createCacheSizeNodes(size_t sizes[], size_t length)
{
    for (size_t i = 0; i < length; i++)
        findOrCreateNodeOfSize(sizes[i]);

    if (head_ == NULLPTR)
        head_ = createNewAccountantAllocationNode(0, NULLPTR);
    else {
        for (MemoryAccountantAllocationNode* lastNode = head_; lastNode; lastNode = lastNode->next_) {
            if (lastNode->next_ == NULLPTR) {
                lastNode->next_ = createNewAccountantAllocationNode(0, NULLPTR);
                break;
            }
        }
    }
}